

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWO2VertexMap(LWOImporter *this,uint length,bool perPoly)

{
  pointer *ppaVar1;
  pointer *ppfVar2;
  ulong *puVar3;
  byte bVar4;
  ushort uVar5;
  pointer puVar6;
  iterator __position;
  pointer pVVar7;
  iterator iVar8;
  pointer pUVar9;
  pointer pWVar10;
  float fVar11;
  byte *pbVar12;
  bool bVar13;
  int iVar14;
  long *plVar15;
  byte *pbVar16;
  uint *puVar17;
  ulong uVar18;
  float *pfVar19;
  Logger *pLVar20;
  runtime_error *this_00;
  byte bVar21;
  uint uVar22;
  long *plVar23;
  ulong uVar24;
  ulong uVar25;
  undefined7 in_register_00000011;
  ulong uVar26;
  aiVector3t<float> *__args;
  pointer pFVar27;
  ReferrerList *this_01;
  ushort uVar28;
  uint uVar29;
  Layer *pLVar30;
  LWOImporter *this_02;
  byte *pbVar31;
  long lVar32;
  Layer *this_03;
  uint uVar33;
  VColorChannel *elem;
  pointer pVVar34;
  pointer pUVar35;
  pointer pWVar36;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  LWOImporter *local_240;
  undefined4 local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  VMapEntry *local_210;
  uint *local_208;
  pointer local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ReferrerList *local_1d8;
  uint local_1cc;
  Layer *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [376];
  
  local_234 = (undefined4)CONCAT71(in_register_00000011,perPoly);
  if (length < 6) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LWO: VMAP chunk is too small","");
    std::runtime_error::runtime_error(this_00,(string *)local_1a8);
    *(undefined ***)this_00 = &PTR__runtime_error_007dd738;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_208 = (uint *)this->mFileBuffer;
  uVar33 = *local_208;
  this->mFileBuffer = (uint8_t *)(local_208 + 1);
  uVar5 = (ushort)local_208[1];
  pbVar16 = (byte *)((long)local_208 + 6);
  this->mFileBuffer = pbVar16;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  pbVar31 = pbVar16;
  if (*(byte *)((long)local_208 + 6) != 0) {
    uVar22 = 1;
    pbVar12 = (byte *)((long)local_208 + 7);
    do {
      pbVar31 = pbVar12;
      if (length < uVar22) {
        pLVar20 = DefaultLogger::get();
        Logger::warn(pLVar20,"LWO: Invalid file, string is is too long");
        pbVar31 = this->mFileBuffer;
        break;
      }
      this->mFileBuffer = pbVar31;
      uVar22 = uVar22 + 1;
      pbVar12 = pbVar31 + 1;
    } while (*pbVar31 != 0);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar16,pbVar31);
  local_1f0 = CONCAT44(local_1f0._4_4_,uVar33);
  uVar33 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 | uVar33 << 0x18;
  uVar28 = uVar5 << 8 | uVar5 >> 8;
  local_240 = this;
  std::__cxx11::string::operator=((string *)&local_230,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  this_02 = local_240;
  local_240->mFileBuffer = local_240->mFileBuffer + (2 - (ulong)((int)pbVar31 - (int)pbVar16 & 1));
  if ((int)uVar33 < 0x52474220) {
    if ((int)uVar33 < 0x4e4f524d) {
      if (uVar33 == 0x4d4e5657) {
LAB_003dc284:
        if (uVar5 != 0x100) {
          pLVar20 = DefaultLogger::get();
          std::operator+(&local_260,"LWO2: Skipping Weight Channel \'",&local_230);
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_260);
          local_1a8._0_8_ = local_1a8 + 0x10;
          plVar23 = plVar15 + 2;
          if ((long *)*plVar15 == plVar23) {
            local_1a8._16_8_ = *plVar23;
            local_1a8._24_8_ = plVar15[3];
          }
          else {
            local_1a8._16_8_ = *plVar23;
            local_1a8._0_8_ = (long *)*plVar15;
          }
          local_1a8._8_8_ = plVar15[1];
          *plVar15 = (long)plVar23;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          Logger::warn(pLVar20,(char *)local_1a8._0_8_);
          goto LAB_003dce5b;
        }
        lVar32 = 0x48;
        if ((int)local_1f0 == 0x54484757) {
          lVar32 = 0x30;
        }
        local_210 = FindEntry<Assimp::LWO::WeightChannel>
                              ((vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                *)((long)&(local_240->mCurLayer->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar32),
                               &local_230,(bool)(char)local_234);
LAB_003dc3f1:
        (*local_210->_vptr_VMapEntry[2])
                  (local_210,
                   (ulong)(uint)((int)((ulong)((long)(this_02->mCurLayer->mTempPoints).
                                                                                                          
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_02->mCurLayer->mTempPoints).
                                                                                                        
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                -0x55555555));
        local_208 = (uint *)((long)local_208 + (ulong)length);
        uVar33 = local_210->dims;
        if ((uint)uVar28 <= local_210->dims) {
          uVar33 = (uint)uVar28;
        }
        uVar26 = (ulong)uVar33;
        puVar17 = (uint *)this_02->mFileBuffer;
        local_1e8 = uVar26;
        if (puVar17 < local_208) {
          this_03 = this_02->mCurLayer;
          this_01 = &this_03->mPointReferrers;
          local_1cc = (int)((ulong)((long)(this_03->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_03->mTempPoints).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555;
          local_1c0 = (ulong)((long)(this_03->mFaces).
                                    super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_03->mFaces).
                                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5;
          local_1b8 = (ulong)((uVar28 - uVar33) * 4);
          local_1b0 = (ulong)(uVar33 * 4);
          local_1e0 = uVar26;
          local_1d8 = this_01;
          local_1c8 = this_03;
          do {
            uVar33 = *puVar17;
            pbVar16 = (byte *)((long)puVar17 + 1);
            this_02->mFileBuffer = pbVar16;
            if ((byte)uVar33 == 0xff) {
              bVar21 = *(byte *)((long)puVar17 + 1);
              this_02->mFileBuffer = (byte *)((long)puVar17 + 2);
              bVar4 = *(byte *)((long)puVar17 + 2);
              pbVar16 = (byte *)((long)puVar17 + 3);
              this_02->mFileBuffer = pbVar16;
              uVar33 = (uint)bVar4 << 8 | (uint)bVar21 << 0x10;
              lVar32 = 4;
            }
            else {
              uVar33 = (uint)(byte)uVar33 << 8;
              lVar32 = 2;
            }
            bVar21 = *pbVar16;
            pbVar16 = (byte *)((long)puVar17 + lVar32);
            this_02->mFileBuffer = pbVar16;
            uVar33 = (bVar21 | uVar33) + this_02->mCurLayer->mPointIDXOfs;
            uVar25 = (ulong)uVar33;
            if (uVar33 < local_1cc) {
              if ((char)local_234 != '\0') {
                bVar21 = *pbVar16;
                pbVar31 = pbVar16 + 1;
                this_02->mFileBuffer = pbVar31;
                if (bVar21 == 0xff) {
                  bVar21 = pbVar16[1];
                  this_02->mFileBuffer = pbVar16 + 2;
                  bVar4 = pbVar16[2];
                  pbVar31 = pbVar16 + 3;
                  this_02->mFileBuffer = pbVar31;
                  uVar22 = (uint)bVar4 << 8 | (uint)bVar21 << 0x10;
                  lVar32 = 4;
                }
                else {
                  uVar22 = (uint)bVar21 << 8;
                  lVar32 = 2;
                }
                bVar21 = *pbVar31;
                this_02->mFileBuffer = pbVar16 + lVar32;
                if (((local_210->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar33 >> 6] >>
                     (uVar25 & 0x3f) & 1) != 0) {
                  uVar33 = (uVar22 | bVar21) + this_02->mCurLayer->mFaceIDXOfs;
                  if ((uint)local_1c0 <= uVar33) {
                    pLVar20 = DefaultLogger::get();
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::basic_formatter<char[38]>
                              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)local_1a8,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'")
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                               local_230._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\', polygon index is out of range",0x20);
                    std::__cxx11::stringbuf::str();
                    Logger::warn(pLVar20,local_260._M_dataplus._M_p);
                    goto LAB_003dc5d8;
                  }
                  pFVar27 = (this_03->mFaces).
                            super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (pFVar27[uVar33].super_aiFace.mNumIndices == 0) {
LAB_003dcf2a:
                    pLVar20 = DefaultLogger::get();
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::basic_formatter<char[38]>
                              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)local_1a8,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'")
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                               local_230._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\', vertex index wasn\'t found in that polygon"
                               ,0x2c);
                    std::__cxx11::stringbuf::str();
                    Logger::warn(pLVar20,&local_260);
                    std::__cxx11::string::~string((string *)&local_260);
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                    __assert_fail("had",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/LWO/LWOLoader.cpp"
                                  ,0x467,
                                  "void Assimp::LWOImporter::LoadLWO2VertexMap(unsigned int, bool)")
                    ;
                  }
                  pFVar27 = pFVar27 + uVar33;
                  uVar24 = 0;
                  bVar13 = false;
                  local_200 = pFVar27;
                  do {
                    uVar33 = (pFVar27->super_aiFace).mIndices[uVar24];
                    uVar18 = uVar25 & 0xffffffff;
                    do {
                      local_1f0 = uVar24;
                      if ((uint)uVar18 == uVar33) {
                        if (uVar33 != 0xffffffff) {
                          local_1a8._0_4_ = 0xffffffff;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                    (this_01,((long)(this_03->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_03->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2) +
                                             1,(value_type_conflict2 *)local_1a8);
                          uVar22 = (int)((ulong)((long)(this_03->mTempPoints).
                                                                                                              
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this_03->mTempPoints).
                                                                                                            
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                   -0x55555555;
                          (local_200->super_aiFace).mIndices[local_1f0] = uVar22;
                          puVar6 = (this_03->mPointReferrers).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                          uVar26 = (ulong)uVar33;
                          do {
                            uVar25 = uVar26;
                            uVar29 = puVar6[uVar25];
                            uVar26 = (ulong)uVar29;
                          } while (uVar29 != 0xffffffff);
                          puVar6[uVar25] = (local_200->super_aiFace).mIndices[local_1f0];
                          __args = (this_03->mTempPoints).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar33;
                          __position._M_current =
                               (this_03->mTempPoints).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this_03->mTempPoints).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                            _M_realloc_insert<aiVector3t<float>const&>
                                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>
                                        *)this_03,__position,__args);
                          }
                          else {
                            (__position._M_current)->z = __args->z;
                            fVar11 = __args->y;
                            (__position._M_current)->x = __args->x;
                            (__position._M_current)->y = fVar11;
                            ppaVar1 = &(this_03->mTempPoints).
                                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *ppaVar1 = *ppaVar1 + 1;
                          }
                          pLVar30 = local_240->mCurLayer;
                          pVVar34 = (pLVar30->mVColorChannels).
                                    super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pVVar7 = (pLVar30->mVColorChannels).
                                   super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          bVar21 = (byte)uVar33;
                          local_1f8 = (ulong)uVar22;
                          if (pVVar34 != pVVar7) {
                            do {
                              if ((pVVar34->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pVVar34->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar33 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pVVar34->super_VMapEntry).abAssigned,
                                           (ulong)(pVVar34->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pVVar34->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pVVar34->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pVVar34->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar29 = 0;
                                  do {
                                    pfVar19 = (pVVar34->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar22 * uVar33 + uVar29);
                                    iVar8._M_current =
                                         (pVVar34->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pVVar34->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pVVar34->super_VMapEntry).rawData,iVar8,pfVar19);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar19;
                                      ppfVar2 = &(pVVar34->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar29 = uVar29 + 1;
                                    uVar22 = (pVVar34->super_VMapEntry).dims;
                                  } while (uVar29 < uVar22);
                                }
                              }
                              pVVar34 = pVVar34 + 1;
                            } while (pVVar34 != pVVar7);
                            pLVar30 = local_240->mCurLayer;
                          }
                          pUVar35 = (pLVar30->mUVChannels).
                                    super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pUVar9 = (pLVar30->mUVChannels).
                                   super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          if (pUVar35 != pUVar9) {
                            do {
                              if ((pUVar35->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pUVar35->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar33 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pUVar35->super_VMapEntry).abAssigned,
                                           (ulong)(pUVar35->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pUVar35->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pUVar35->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pUVar35->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar29 = 0;
                                  do {
                                    pfVar19 = (pUVar35->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar22 * uVar33 + uVar29);
                                    iVar8._M_current =
                                         (pUVar35->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pUVar35->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pUVar35->super_VMapEntry).rawData,iVar8,pfVar19);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar19;
                                      ppfVar2 = &(pUVar35->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar29 = uVar29 + 1;
                                    uVar22 = (pUVar35->super_VMapEntry).dims;
                                  } while (uVar29 < uVar22);
                                }
                              }
                              pUVar35 = pUVar35 + 1;
                            } while (pUVar35 != pUVar9);
                            pLVar30 = local_240->mCurLayer;
                          }
                          pWVar36 = (pLVar30->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar10 = (pLVar30->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar36 != pWVar10) {
                            do {
                              if ((pWVar36->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pWVar36->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar33 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar36->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar36->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar36->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar36->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pWVar36->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar29 = 0;
                                  do {
                                    pfVar19 = (pWVar36->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar22 * uVar33 + uVar29);
                                    iVar8._M_current =
                                         (pWVar36->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pWVar36->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar36->super_VMapEntry).rawData,iVar8,pfVar19);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar19;
                                      ppfVar2 = &(pWVar36->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar29 = uVar29 + 1;
                                    uVar22 = (pWVar36->super_VMapEntry).dims;
                                  } while (uVar29 < uVar22);
                                }
                              }
                              pWVar36 = pWVar36 + 1;
                            } while (pWVar36 != pWVar10);
                            pLVar30 = local_240->mCurLayer;
                          }
                          pWVar36 = (pLVar30->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar10 = (pLVar30->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar36 != pWVar10) {
                            do {
                              if ((pWVar36->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pWVar36->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar33 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar21 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar36->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar36->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar36->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar36->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar22 = (pWVar36->super_VMapEntry).dims;
                                if (uVar22 != 0) {
                                  uVar29 = 0;
                                  do {
                                    pfVar19 = (pWVar36->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar22 * uVar33 + uVar29);
                                    iVar8._M_current =
                                         (pWVar36->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pWVar36->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar36->super_VMapEntry).rawData,iVar8,pfVar19);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar19;
                                      ppfVar2 = &(pWVar36->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar29 = uVar29 + 1;
                                    uVar22 = (pWVar36->super_VMapEntry).dims;
                                  } while (uVar29 < uVar22);
                                }
                              }
                              pWVar36 = pWVar36 + 1;
                            } while (pWVar36 != pWVar10);
                            pLVar30 = local_240->mCurLayer;
                          }
                          uVar25 = local_1f8;
                          bVar13 = true;
                          pFVar27 = local_200;
                          this_01 = local_1d8;
                          this_02 = local_240;
                          this_03 = local_1c8;
                          uVar26 = local_1e0;
                          if ((pLVar30->mNormals).super_VMapEntry.name._M_string_length != 0) {
                            puVar3 = (pLVar30->mNormals).super_VMapEntry.abAssigned.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     + (uVar33 >> 6);
                            *puVar3 = *puVar3 | 1L << (bVar21 & 0x3f);
                            std::vector<bool,_std::allocator<bool>_>::resize
                                      (&(pLVar30->mNormals).super_VMapEntry.abAssigned,
                                       (ulong)(pLVar30->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_offset +
                                       ((long)(pLVar30->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_p -
                                       (long)(pLVar30->mNormals).super_VMapEntry.abAssigned.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p) * 8 + 1,false);
                            this_03 = local_1c8;
                            uVar22 = (pLVar30->mNormals).super_VMapEntry.dims;
                            pFVar27 = local_200;
                            this_01 = local_1d8;
                            this_02 = local_240;
                            uVar26 = local_1e0;
                            if (uVar22 != 0) {
                              uVar29 = 0;
                              do {
                                pfVar19 = (pLVar30->mNormals).super_VMapEntry.rawData.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          (uVar22 * uVar33 + uVar29);
                                iVar8._M_current =
                                     (pLVar30->mNormals).super_VMapEntry.rawData.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                                if (iVar8._M_current ==
                                    (pLVar30->mNormals).super_VMapEntry.rawData.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<float,std::allocator<float>>::
                                  _M_realloc_insert<float_const&>
                                            ((vector<float,std::allocator<float>> *)
                                             &(pLVar30->mNormals).super_VMapEntry.rawData,iVar8,
                                             pfVar19);
                                }
                                else {
                                  *iVar8._M_current = *pfVar19;
                                  ppfVar2 = &(pLVar30->mNormals).super_VMapEntry.rawData.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish;
                                  *ppfVar2 = *ppfVar2 + 1;
                                }
                                uVar29 = uVar29 + 1;
                                uVar22 = (pLVar30->mNormals).super_VMapEntry.dims;
                                pFVar27 = local_200;
                                this_01 = local_1d8;
                                this_02 = local_240;
                                uVar26 = local_1e0;
                              } while (uVar29 < uVar22);
                            }
                          }
                        }
                        break;
                      }
                      uVar22 = (this_01->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar18];
                      uVar18 = (ulong)uVar22;
                    } while (uVar22 != 0xffffffff);
                    uVar33 = (uint)uVar25;
                    uVar24 = local_1f0 + 1;
                  } while (uVar24 < (pFVar27->super_aiFace).mNumIndices);
                  if (!bVar13) goto LAB_003dcf2a;
                }
              }
              pfVar19 = (float *)operator_new__(local_1b0);
              if ((uint)local_1e8 != 0) {
                uVar25 = 0;
                puVar17 = (uint *)this_02->mFileBuffer;
                do {
                  uVar22 = *puVar17;
                  this_02->mFileBuffer = (uint8_t *)(puVar17 + 1);
                  pfVar19[uVar25] =
                       (float)(uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                              uVar22 << 0x18);
                  uVar25 = uVar25 + 1;
                  puVar17 = puVar17 + 1;
                } while (uVar26 != uVar25);
              }
              DoRecursiveVMAPAssignment(this_02,local_210,(uint)local_1e8,uVar33,pfVar19);
              this_02->mFileBuffer = this_02->mFileBuffer + local_1b8;
              operator_delete__(pfVar19);
              puVar17 = (uint *)this_02->mFileBuffer;
            }
            else {
              pLVar20 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[43]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [43])"LWO2: Failure evaluating VMAP/VMAD entry \'");
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\', vertex index is out of range",0x1f);
              std::__cxx11::stringbuf::str();
              Logger::warn(pLVar20,local_260._M_dataplus._M_p);
LAB_003dc5d8:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              puVar17 = (uint *)(this_02->mFileBuffer + (local_210->dims << 2));
              this_02->mFileBuffer = (uint8_t *)puVar17;
            }
          } while (puVar17 < local_208);
        }
        goto LAB_003dce93;
      }
      if (uVar33 == 0x4d4f5246) goto LAB_003dce93;
    }
    else {
      if (uVar33 == 0x4e4f524d) {
        iVar14 = std::__cxx11::string::compare((char *)&local_230);
        if ((uVar5 != 0x300 || iVar14 != 0) ||
           ((this_02->mCurLayer->mNormals).super_VMapEntry.name._M_string_length != 0))
        goto LAB_003dce93;
        pLVar20 = DefaultLogger::get();
        Logger::info(pLVar20,"Processing non-standard extension: MODO VMAP.NORM.vert_normals");
        std::__cxx11::string::_M_assign
                  ((string *)&(this_02->mCurLayer->mNormals).super_VMapEntry.name);
        local_210 = &(this_02->mCurLayer->mNormals).super_VMapEntry;
        goto LAB_003dc3f1;
      }
      if (uVar33 == 0x5049434b) goto LAB_003dce93;
    }
  }
  else if ((int)uVar33 < 0x53504f54) {
    if ((uVar33 == 0x52474220) || (uVar33 == 0x52474241)) {
      if (uVar28 - 5 < 0xfffffffe) {
        pLVar20 = DefaultLogger::get();
        std::operator+(&local_260,"LWO2: Skipping Color Map \'",&local_230);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_260);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_1a8._16_8_ = *plVar23;
          local_1a8._24_8_ = plVar15[3];
        }
        else {
          local_1a8._16_8_ = *plVar23;
          local_1a8._0_8_ = (long *)*plVar15;
        }
        local_1a8._8_8_ = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        Logger::warn(pLVar20,(char *)local_1a8._0_8_);
LAB_003dce5b:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003dce93;
      }
      local_210 = FindEntry<Assimp::LWO::VColorChannel>
                            (&local_240->mCurLayer->mVColorChannels,&local_230,(bool)(char)local_234
                            );
      goto LAB_003dc3f1;
    }
  }
  else {
    if (uVar33 == 0x53504f54) goto LAB_003dce93;
    if (uVar33 == 0x54585556) {
      if (uVar5 != 0x200) {
        pLVar20 = DefaultLogger::get();
        std::operator+(&local_260,"LWO2: Skipping UV channel \'",&local_230);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_260);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar23 = plVar15 + 2;
        if ((long *)*plVar15 == plVar23) {
          local_1a8._16_8_ = *plVar23;
          local_1a8._24_8_ = plVar15[3];
        }
        else {
          local_1a8._16_8_ = *plVar23;
          local_1a8._0_8_ = (long *)*plVar15;
        }
        local_1a8._8_8_ = plVar15[1];
        *plVar15 = (long)plVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        Logger::warn(pLVar20,(char *)local_1a8._0_8_);
        goto LAB_003dce5b;
      }
      local_210 = FindEntry<Assimp::LWO::UVChannel>
                            (&local_240->mCurLayer->mUVChannels,&local_230,(bool)(char)local_234);
      goto LAB_003dc3f1;
    }
    if (uVar33 == 0x57474854) goto LAB_003dc284;
  }
  std::__cxx11::string::compare((char *)&local_230);
  pLVar20 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[43]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [43])"LWO2: Skipping unknown VMAP/VMAD channel \'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar20,local_260._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_003dce93:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,
                    CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                             local_230.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2VertexMap(unsigned int length, bool perPoly)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,VMAP,6);
    unsigned int type = GetU4();
    unsigned int dims = GetU2();

    VMapEntry* base;

    // read the name of the vertex map
    std::string name;
    GetS0(name,length);

    switch (type)
    {
    case AI_LWO_TXUV:
        if (dims != 2)  {
            ASSIMP_LOG_WARN("LWO2: Skipping UV channel \'"
            + name + "\' with !2 components");
            return;
        }
        base = FindEntry(mCurLayer->mUVChannels,name,perPoly);
        break;
    case AI_LWO_WGHT:
    case AI_LWO_MNVW:
        if (dims != 1)  {
            ASSIMP_LOG_WARN("LWO2: Skipping Weight Channel \'"
            + name + "\' with !1 components");
            return;
        }
        base = FindEntry((type == AI_LWO_WGHT ? mCurLayer->mWeightChannels
            : mCurLayer->mSWeightChannels),name,perPoly);
        break;
    case AI_LWO_RGB:
    case AI_LWO_RGBA:
        if (dims != 3 && dims != 4) {
            ASSIMP_LOG_WARN("LWO2: Skipping Color Map \'"
            + name + "\' with a dimension > 4 or < 3");
            return;
        }
        base = FindEntry(mCurLayer->mVColorChannels,name,perPoly);
        break;

    case AI_LWO_MODO_NORM:
        /*  This is a non-standard extension chunk used by Luxology's MODO.
         *  It stores per-vertex normals. This VMAP exists just once, has
         *  3 dimensions and is btw extremely beautiful.
         */
        if (name != "vert_normals" || dims != 3 || mCurLayer->mNormals.name.length())
            return;

        ASSIMP_LOG_INFO("Processing non-standard extension: MODO VMAP.NORM.vert_normals");

        mCurLayer->mNormals.name = name;
        base = & mCurLayer->mNormals;
        break;

    case AI_LWO_PICK: /* these VMAPs are just silently dropped */
    case AI_LWO_MORF:
    case AI_LWO_SPOT:
        return;

    default:
        if (name == "APS.Level") {
            // XXX handle this (seems to be subdivision-related).
        }
        ASSIMP_LOG_WARN_F("LWO2: Skipping unknown VMAP/VMAD channel \'", name, "\'");
        return;
    };
    base->Allocate((unsigned int)mCurLayer->mTempPoints.size());

    // now read all entries in the map
    type = std::min(dims,base->dims);
    const unsigned int diff = (dims - type)<<2u;

    LWO::FaceList& list = mCurLayer->mFaces;
    LWO::PointList& pointList = mCurLayer->mTempPoints;
    LWO::ReferrerList& refList = mCurLayer->mPointReferrers;

    const unsigned int numPoints = (unsigned int)pointList.size();
    const unsigned int numFaces  = (unsigned int)list.size();

    while (mFileBuffer < end)   {

        unsigned int idx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mPointIDXOfs;
        if (idx >= numPoints)   {
            ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAP/VMAD entry \'", name, "\', vertex index is out of range");
            mFileBuffer += base->dims<<2u;
            continue;
        }
        if (perPoly)    {
            unsigned int polyIdx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
            if (base->abAssigned[idx])  {
                // we have already a VMAP entry for this vertex - thus
                // we need to duplicate the corresponding polygon.
                if (polyIdx >= numFaces)    {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', polygon index is out of range");
                    mFileBuffer += base->dims<<2u;
                    continue;
                }

                LWO::Face& src = list[polyIdx];

                // generate a new unique vertex for the corresponding index - but only
                // if we can find the index in the face
                bool had = false;
                for (unsigned int i = 0; i < src.mNumIndices;++i)   {

                    unsigned int srcIdx = src.mIndices[i], tmp = idx;
                    do {
                        if (tmp == srcIdx)
                            break;
                    }
                    while ((tmp = refList[tmp]) != UINT_MAX);
                    if (tmp == UINT_MAX) {
                        continue;
                    }

                    had = true;
                    refList.resize(refList.size()+1, UINT_MAX);

                    idx = (unsigned int)pointList.size();
                    src.mIndices[i] = (unsigned int)pointList.size();

                    // store the index of the new vertex in the old vertex
                    // so we get a single linked list we can traverse in
                    // only one direction
                    AddToSingleLinkedList(refList,srcIdx,src.mIndices[i]);
                    pointList.push_back(pointList[srcIdx]);

                    CreateNewEntry(mCurLayer->mVColorChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mUVChannels,      srcIdx );
                    CreateNewEntry(mCurLayer->mWeightChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mSWeightChannels, srcIdx );
                    CreateNewEntry(mCurLayer->mNormals, srcIdx );
                }
                if (!had) {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', vertex index wasn't found in that polygon");
                    ai_assert(had);
                }
            }
        }

        std::unique_ptr<float[]> temp(new float[type]);
        for (unsigned int l = 0; l < type;++l)
            temp[l] = GetF4();

        DoRecursiveVMAPAssignment(base,type,idx, temp.get());
        mFileBuffer += diff;
    }
}